

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O2

HTMLElement * __thiscall
soul::HTMLGenerator::printExpression(HTMLGenerator *this,HTMLElement *parent,Expression *e)

{
  pointer pSVar1;
  char *__s;
  HTMLElement *pHVar2;
  size_t sVar3;
  pointer pSVar4;
  string_view linkURL;
  string_view value;
  string_view text;
  string_view classToUse;
  string_view text_00;
  anon_class_1_0_00000001 getClassForTypeSection;
  anon_class_1_0_00000001 local_59;
  HTMLElement *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar1 = (e->sections).
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = parent;
  for (pSVar4 = (e->sections).
                super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
    __s = printExpression::anon_class_1_0_00000001::operator()(&local_59,pSVar4->type);
    if ((pSVar4->type == structure) && ((pSVar4->referencedUID)._M_string_length != 0)) {
      std::operator+(&local_50,"#",&pSVar4->referencedUID);
      linkURL._M_str = local_50._M_dataplus._M_p;
      linkURL._M_len = local_50._M_string_length;
      pHVar2 = choc::html::HTMLElement::addLink(local_58,linkURL);
      sVar3 = strlen(__s);
      value._M_str = __s;
      value._M_len = sVar3;
      pHVar2 = choc::html::HTMLElement::setClass(pHVar2,value);
      text._M_str = (pSVar4->text)._M_dataplus._M_p;
      text._M_len = (pSVar4->text)._M_string_length;
      choc::html::HTMLElement::addContent(pHVar2,text);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      sVar3 = strlen(__s);
      classToUse._M_str = __s;
      classToUse._M_len = sVar3;
      pHVar2 = choc::html::HTMLElement::addSpan(local_58,classToUse);
      text_00._M_str = (pSVar4->text)._M_dataplus._M_p;
      text_00._M_len = (pSVar4->text)._M_string_length;
      choc::html::HTMLElement::addContent(pHVar2,text_00);
    }
  }
  return local_58;
}

Assistant:

choc::html::HTMLElement& printExpression (choc::html::HTMLElement& parent,
                                              const SourceCodeModel::Expression& e)
    {
        auto getClassForTypeSection = [] (SourceCodeModel::Expression::Section::Type t) -> const char*
        {
            if (t == SourceCodeModel::Expression::Section::Type::keyword)   return "keyword";
            if (t == SourceCodeModel::Expression::Section::Type::structure) return "struct_name";
            if (t == SourceCodeModel::Expression::Section::Type::primitive) return "primitive_type";

            SOUL_ASSERT (t == SourceCodeModel::Expression::Section::Type::text);
            return "typename_text";
        };

        for (auto& s : e.sections)
        {
            auto classID = getClassForTypeSection (s.type);

            if (s.type == SourceCodeModel::Expression::Section::Type::structure)
            {
                if (! s.referencedUID.empty())
                {
                    parent.addLink ("#" + s.referencedUID).setClass (classID).addContent (s.text);
                    continue;
                }
            }

            parent.addSpan (classID).addContent (s.text);
        }

        return parent;
    }